

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O1

lzma_ret lzma_filters_copy(lzma_filter *src,lzma_filter *dest,lzma_allocator *allocator)

{
  lzma_filter *plVar1;
  size_t size;
  int iVar2;
  lzma_vli lVar3;
  void *__dest;
  anon_struct_24_5_040317c8 *paVar4;
  long lVar5;
  lzma_ret lVar6;
  ulong uVar7;
  long lVar8;
  lzma_ret local_44;
  
  lVar6 = LZMA_PROG_ERROR;
  if (dest != (lzma_filter *)0x0 && src != (lzma_filter *)0x0) {
    lVar3 = src->id;
    if (lVar3 == 0xffffffffffffffff) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        if (uVar7 == 4) {
          local_44 = LZMA_OPTIONS_ERROR;
          uVar7 = 4;
LAB_001ae7ae:
          if (uVar7 == 0) {
            return local_44;
          }
          lVar8 = uVar7 << 4;
          do {
            lzma_free(*(void **)((long)dest + lVar8 + -8),allocator);
            *(undefined8 *)((long)dest + lVar8 + -8) = 0;
            lVar8 = lVar8 + -0x10;
          } while (lVar8 != 0);
          return local_44;
        }
        plVar1 = src + uVar7;
        dest[uVar7].id = lVar3;
        if (plVar1->options == (void *)0x0) {
          dest[uVar7].options = (void *)0x0;
        }
        else {
          paVar4 = features;
          if (plVar1->id != 0x4000000000000001) {
            lVar8 = 0;
            do {
              lVar5 = lVar8;
              if (lVar5 + 0x18 == 0xf0) {
                iVar2 = 5;
                local_44 = LZMA_OPTIONS_ERROR;
                goto LAB_001ae758;
              }
              lVar8 = lVar5 + 0x18;
            } while (plVar1->id != *(lzma_vli *)((long)&features[1].id + lVar5));
            paVar4 = (anon_struct_24_5_040317c8 *)(lVar5 + 0x27ca78);
          }
          size = paVar4->options_size;
          __dest = lzma_alloc(size,allocator);
          dest[uVar7].options = __dest;
          if (__dest == (void *)0x0) {
            local_44 = LZMA_MEM_ERROR;
            iVar2 = 5;
          }
          else {
            memcpy(__dest,plVar1->options,size);
            iVar2 = 0;
          }
LAB_001ae758:
          if (iVar2 != 0) {
            if (iVar2 != 5) {
              return local_44;
            }
            goto LAB_001ae7ae;
          }
        }
        uVar7 = uVar7 + 1;
        lVar3 = src[uVar7].id;
      } while (lVar3 != 0xffffffffffffffff);
    }
    if (5 < uVar7) {
      __assert_fail("i <= LZMA_FILTERS_MAX + 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/filter_common.c"
                    ,0xb0,
                    "lzma_ret lzma_filters_copy(const lzma_filter *, lzma_filter *, const lzma_allocator *)"
                   );
    }
    dest[uVar7].id = 0xffffffffffffffff;
    dest[uVar7].options = (void *)0x0;
    lVar6 = LZMA_OK;
  }
  return lVar6;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_filters_copy(const lzma_filter *src, lzma_filter *dest,
		const lzma_allocator *allocator)
{
	if (src == NULL || dest == NULL)
		return LZMA_PROG_ERROR;

	lzma_ret ret;
	size_t i;
	for (i = 0; src[i].id != LZMA_VLI_UNKNOWN; ++i) {
		// There must be a maximum of four filters plus
		// the array terminator.
		if (i == LZMA_FILTERS_MAX) {
			ret = LZMA_OPTIONS_ERROR;
			goto error;
		}

		dest[i].id = src[i].id;

		if (src[i].options == NULL) {
			dest[i].options = NULL;
		} else {
			// See if the filter is supported only when the
			// options is not NULL. This might be convenient
			// sometimes if the app is actually copying only
			// a partial filter chain with a place holder ID.
			//
			// When options is not NULL, the Filter ID must be
			// supported by us, because otherwise we don't know
			// how big the options are.
			size_t j;
			for (j = 0; src[i].id != features[j].id; ++j) {
				if (features[j].id == LZMA_VLI_UNKNOWN) {
					ret = LZMA_OPTIONS_ERROR;
					goto error;
				}
			}

			// Allocate and copy the options.
			dest[i].options = lzma_alloc(features[j].options_size,
					allocator);
			if (dest[i].options == NULL) {
				ret = LZMA_MEM_ERROR;
				goto error;
			}

			memcpy(dest[i].options, src[i].options,
					features[j].options_size);
		}
	}

	// Terminate the filter array.
	assert(i <= LZMA_FILTERS_MAX + 1);
	dest[i].id = LZMA_VLI_UNKNOWN;
	dest[i].options = NULL;

	return LZMA_OK;

error:
	// Free the options which we have already allocated.
	while (i-- > 0) {
		lzma_free(dest[i].options, allocator);
		dest[i].options = NULL;
	}

	return ret;
}